

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O3

void xlsxioread_sheet_close(xlsxioreadersheet sheethandle)

{
  if (sheethandle != (xlsxioreadersheet)0x0) {
    if ((sheethandle->processcallbackdata).xmlparser != (XML_Parser)0x0) {
      XML_ParserFree();
    }
    data_sheet_callback_data_cleanup(&sheethandle->processcallbackdata);
    if (sheethandle->zipfile != (unzFile *)0x0) {
      unzCloseCurrentFile();
    }
    free(sheethandle);
    return;
  }
  return;
}

Assistant:

DLL_EXPORT_XLSXIO void xlsxioread_sheet_close (xlsxioreadersheet sheethandle)
{
  if (!sheethandle)
    return;
  if (sheethandle->processcallbackdata.xmlparser)
    XML_ParserFree(sheethandle->processcallbackdata.xmlparser);
  data_sheet_callback_data_cleanup(&sheethandle->processcallbackdata);
  if (sheethandle->zipfile)
#ifdef USE_MINIZIP
    unzCloseCurrentFile(sheethandle->zipfile);
#else
    zip_fclose(sheethandle->zipfile);
#endif
  free(sheethandle);
}